

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printSwitch(JSPrinter *this,Ref node)

{
  size_t sVar1;
  bool bVar2;
  Ref *pRVar3;
  ulong uVar4;
  Ref local_48;
  Ref node_local;
  Ref c;
  Ref cases;
  
  local_48.inst = node.inst;
  emit(this,"switch");
  space(this);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  pRVar3 = Ref::operator[](&local_48,1);
  print(this,pRVar3->inst);
  maybeSpace(this,')');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ')';
  space(this);
  maybeSpace(this,'{');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '{';
  newline(this);
  pRVar3 = Ref::operator[](&local_48,2);
  c.inst = pRVar3->inst;
  if ((c.inst)->type == Array) {
    uVar4 = 0;
    do {
      if (((((c.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements <= uVar4) {
        emit(this,'}');
        return;
      }
      pRVar3 = Ref::operator[](&c,(uint)uVar4);
      node_local.inst = pRVar3->inst;
      pRVar3 = Ref::operator[](&node_local,0);
      bVar2 = Ref::operator!(pRVar3);
      if (bVar2) {
        emit(this,"default:");
      }
      else {
        emit(this,"case ");
        pRVar3 = Ref::operator[](&node_local,0);
        print(this,pRVar3->inst);
        maybeSpace(this,':');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ':';
      }
      pRVar3 = Ref::operator[](&node_local,1);
      if (pRVar3->inst->type != Array) break;
      if ((((pRVar3->inst->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements == 0) {
LAB_00d0ee94:
        newline(this);
      }
      else {
        this->indent = this->indent + 1;
        newline(this);
        sVar1 = this->used;
        pRVar3 = Ref::operator[](&node_local,1);
        printStats(this,pRVar3->inst);
        this->indent = this->indent + -1;
        if (sVar1 != this->used) goto LAB_00d0ee94;
        this->used = sVar1 - 1;
      }
      uVar4 = uVar4 + 1;
    } while ((c.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printSwitch(Ref node) {
    emit("switch");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    emit('{');
    newline();
    Ref cases = node[2];
    for (size_t i = 0; i < cases->size(); i++) {
      Ref c = cases[i];
      if (!c[0]) {
        emit("default:");
      } else {
        emit("case ");
        print(c[0]);
        emit(':');
      }
      if (c[1]->size() > 0) {
        indent++;
        newline();
        auto curr = used;
        printStats(c[1]);
        indent--;
        if (curr != used) {
          newline();
        } else {
          used--; // avoid the extra indentation we added tentatively
        }
      } else {
        newline();
      }
    }
    emit('}');
  }